

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.hpp
# Opt level: O1

void just::temp::directory::delete_empty_dir(string *path_)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  iVar1 = rmdir((path_->_M_dataplus)._M_p);
  if (iVar1 == 0) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_38,"Error deleting empty directory ",path_);
  std::runtime_error::runtime_error(this,(string *)&bStack_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void delete_empty_dir(const std::string& path_)
      {
#ifdef _WIN32
        if (!RemoveDirectory(path_.c_str()))
#else
        if (rmdir(path_.c_str()))
#endif
        {
          throw std::runtime_error("Error deleting empty directory " + path_);
        }
      }